

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fkParentIsModified(Table *pTab,FKey *p,int *aChange,int bChngRowid)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  if ((long)p->nCol < 1) {
    return 0;
  }
  lVar5 = 0;
  do {
    if (0 < pTab->nCol) {
      pcVar3 = p->aCol[lVar5].zCol;
      uVar4 = 0;
      do {
        if ((-1 < aChange[uVar4]) || ((bChngRowid != 0 && (uVar4 == (uint)(int)pTab->iPKey)))) {
          if (pcVar3 != (char *)0x0) {
            lVar6 = 0;
            do {
              bVar1 = pTab->aCol[uVar4].zName[lVar6];
              bVar2 = pcVar3[lVar6];
              if (bVar1 == bVar2) {
                if ((ulong)bVar1 == 0) {
                  return 1;
                }
              }
              else if (""[bVar1] != ""[bVar2]) goto LAB_001b4b6d;
              lVar6 = lVar6 + 1;
            } while( true );
          }
          if ((pTab->aCol[uVar4].colFlags & 1) != 0) {
            return 1;
          }
        }
LAB_001b4b6d:
        uVar4 = uVar4 + 1;
      } while (uVar4 != (long)pTab->nCol);
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == p->nCol) {
      return 0;
    }
  } while( true );
}

Assistant:

static int fkParentIsModified(
  Table *pTab, 
  FKey *p, 
  int *aChange, 
  int bChngRowid
){
  int i;
  for(i=0; i<p->nCol; i++){
    char *zKey = p->aCol[i].zCol;
    int iKey;
    for(iKey=0; iKey<pTab->nCol; iKey++){
      if( aChange[iKey]>=0 || (iKey==pTab->iPKey && bChngRowid) ){
        Column *pCol = &pTab->aCol[iKey];
        if( zKey ){
          if( 0==sqlite3StrICmp(pCol->zName, zKey) ) return 1;
        }else if( pCol->colFlags & COLFLAG_PRIMKEY ){
          return 1;
        }
      }
    }
  }
  return 0;
}